

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall
kratos::SwitchStmt::remove_switch_case
          (SwitchStmt *this,shared_ptr<kratos::Const> *switch_case,shared_ptr<kratos::Stmt> *stmt)

{
  element_type *peVar1;
  element_type *peVar2;
  _Rb_tree_header *p_Var3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  
  p_Var5 = (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var3 = &(this->body_)._M_t._M_impl.super__Rb_tree_header;
    peVar1 = (switch_case->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var6 = &p_Var3->_M_header;
    do {
      if (*(element_type **)(p_Var5 + 1) >= peVar1) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(element_type **)(p_Var5 + 1) < peVar1];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var3) && (*(element_type **)(p_Var6 + 1) <= peVar1)) {
      pmVar4 = std::
               map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
               ::at(&this->body_,switch_case);
      peVar2 = (pmVar4->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[10])(peVar2,stmt);
      return;
    }
  }
  return;
}

Assistant:

void SwitchStmt::remove_switch_case(const std::shared_ptr<kratos::Const> &switch_case,
                                    const std::shared_ptr<kratos::Stmt> &stmt) {
    if (body_.find(switch_case) != body_.end()) {
        auto &stmts = body_.at(switch_case);
        stmts->remove_stmt(stmt);
    }
}